

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBuffer.cpp
# Opt level: O1

void __thiscall Jupiter::DataBuffer::setBufferSize(DataBuffer *this,size_t size_)

{
  uint8_t *puVar1;
  size_t __n;
  
  this->bufferSize = size_;
  puVar1 = this->head;
  __n = (long)this->end - (long)puVar1;
  if (this->base != puVar1) {
    memmove(this->base,puVar1,__n);
  }
  puVar1 = (uint8_t *)realloc(this->base,this->bufferSize);
  this->base = puVar1;
  this->head = puVar1;
  this->end = puVar1 + __n;
  return;
}

Assistant:

void Jupiter::DataBuffer::setBufferSize(size_t size_) {
	Jupiter::DataBuffer::bufferSize = size_;
	size_ = Jupiter::DataBuffer::end - Jupiter::DataBuffer::head;

	if (Jupiter::DataBuffer::base != Jupiter::DataBuffer::head)
		memmove(Jupiter::DataBuffer::base, Jupiter::DataBuffer::head, size_);

	Jupiter::DataBuffer::base = reinterpret_cast<uint8_t *>(realloc(Jupiter::DataBuffer::base, Jupiter::DataBuffer::bufferSize));
	Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
	Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + size_;
}